

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::HelpersTest_TestSCCAnalysis_Test::TestBody
          (HelpersTest_TestSCCAnalysis_Test *this)

{
  bool bVar1;
  MessageAnalysis MVar2;
  Descriptor *pDVar3;
  SCC *pSVar4;
  char *pcVar5;
  AssertHelper local_9b8;
  Message local_9b0;
  bool local_9a1;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar_11;
  Message local_988;
  bool local_979;
  undefined1 local_978 [8];
  AssertionResult gtest_ar_10;
  Message local_960;
  bool local_951;
  undefined1 local_950 [8];
  AssertionResult gtest_ar_9;
  Message local_938;
  bool local_929;
  undefined1 local_928 [8];
  AssertionResult gtest_ar_8;
  MessageAnalysis result_2;
  SCC *scc_2;
  SplitMap *pSStack_900;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  FieldListenerOptions local_878;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined1 local_830 [8];
  MessageSCCAnalyzer scc_analyzer_2;
  TestRequired msg_2;
  Message local_630;
  bool local_621;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_7;
  Message local_608;
  bool local_5f9;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_6;
  Message local_5e0;
  bool local_5d1;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_5;
  Message local_5b8;
  bool local_5a9;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_4;
  MessageAnalysis result_1;
  SCC *scc_1;
  SplitMap *pSStack_580;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  FieldListenerOptions local_4f8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined1 local_4a8 [8];
  MessageSCCAnalyzer scc_analyzer_1;
  TestAllExtensions msg_1;
  Message local_320;
  bool local_311;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_3;
  Message local_2f8;
  bool local_2e9;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_2;
  Message local_2d0;
  bool local_2c1;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_1;
  Message local_2a8;
  bool local_299;
  undefined1 local_298 [8];
  AssertionResult gtest_ar;
  MessageAnalysis result;
  SCC *scc;
  Options local_268;
  undefined1 local_188 [8];
  MessageSCCAnalyzer scc_analyzer;
  TestRecursiveMessage msg;
  HelpersTest_TestSCCAnalysis_Test *this_local;
  
  proto2_unittest::TestRecursiveMessage::TestRecursiveMessage
            ((TestRecursiveMessage *)
             ((long)&scc_analyzer.analysis_cache_.
                     super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                     .
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
             + 0x18));
  local_268.bounds_check_mode = kNoEnforcement;
  local_268.proto_h = false;
  local_268.transitive_pb_h = false;
  local_268.annotate_headers = false;
  local_268.lite_implicit_weak_fields = false;
  local_268.descriptor_implicit_weak_messages = false;
  local_268.bootstrap = false;
  local_268.opensource_runtime = false;
  local_268.annotate_accessor = false;
  local_268.force_split = false;
  local_268.force_eagerly_verified_lazy = false;
  local_268.force_inline_string = false;
  local_268.strip_nonfunctional_codegen = false;
  local_268.field_listener_options.forbidden_field_listener_events.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)0x0;
  local_268.enforce_mode = kNoEnforcement;
  local_268.num_cc_files = 0;
  local_268.field_listener_options.forbidden_field_listener_events.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_268.field_listener_options.forbidden_field_listener_events.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = (ctrl_t *)0x0;
  local_268.field_listener_options.inject_field_listener_events = false;
  local_268.field_listener_options._1_7_ = 0;
  local_268.field_listener_options.forbidden_field_listener_events.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_268.annotation_guard_name.field_2._M_allocated_capacity = 0;
  local_268.annotation_guard_name.field_2._8_8_ = 0;
  local_268.annotation_guard_name._M_dataplus = (_Alloc_hider)0x0;
  local_268.annotation_guard_name._1_7_ = 0;
  local_268.annotation_guard_name._M_string_length = 0;
  local_268.annotation_pragma_name.field_2._M_allocated_capacity = 0;
  local_268.annotation_pragma_name.field_2._8_8_ = 0;
  local_268.annotation_pragma_name._M_dataplus = (_Alloc_hider)0x0;
  local_268.annotation_pragma_name._1_7_ = 0;
  local_268.annotation_pragma_name._M_string_length = 0;
  local_268.runtime_include_base.field_2._M_allocated_capacity = 0;
  local_268.runtime_include_base.field_2._8_8_ = 0;
  local_268.runtime_include_base._M_dataplus = (_Alloc_hider)0x0;
  local_268.runtime_include_base._1_7_ = 0;
  local_268.runtime_include_base._M_string_length = 0;
  local_268.dllexport_decl.field_2._M_allocated_capacity = 0;
  local_268.dllexport_decl.field_2._8_8_ = 0;
  local_268.dllexport_decl._M_dataplus = (_Alloc_hider)0x0;
  local_268.dllexport_decl._1_7_ = 0;
  local_268.dllexport_decl._M_string_length = 0;
  local_268.access_info_map = (AccessInfoMap *)0x0;
  local_268.split_map = (SplitMap *)0x0;
  local_268.experimental_use_micro_string = false;
  local_268._209_7_ = 0;
  Options::Options(&local_268);
  MessageSCCAnalyzer::MessageSCCAnalyzer((MessageSCCAnalyzer *)local_188,&local_268);
  Options::~Options(&local_268);
  pDVar3 = proto2_unittest::TestRecursiveMessage::GetDescriptor();
  pSVar4 = MessageSCCAnalyzer::GetSCC((MessageSCCAnalyzer *)local_188,pDVar3);
  MVar2 = MessageSCCAnalyzer::GetSCCAnalysis((MessageSCCAnalyzer *)local_188,pSVar4);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._3_4_ = MVar2._0_4_;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = MVar2.contains_weak;
  local_299 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_298,"result.is_recursive","true",
             (bool *)((long)&gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 3),&local_299);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x837,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  local_2c1 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_2c0,"result.contains_required","false",
             (bool *)((long)&gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 6),&local_2c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x838,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  local_2e9 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_2e8,"result.contains_cord","false",
             (bool *)((long)&gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4),&local_2e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x839,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  local_311 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_310,"result.contains_extension","false",
             (bool *)((long)&gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 5),&local_311);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&msg_1.field_0._impl_._cached_size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x83a,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&msg_1.field_0._impl_._cached_size_,&local_320);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&msg_1.field_0._impl_._cached_size_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  MessageSCCAnalyzer::~MessageSCCAnalyzer((MessageSCCAnalyzer *)local_188);
  proto2_unittest::TestRecursiveMessage::~TestRecursiveMessage
            ((TestRecursiveMessage *)
             ((long)&scc_analyzer.analysis_cache_.
                     super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                     .
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
             + 0x18));
  proto2_unittest::TestAllExtensions::TestAllExtensions
            ((TestAllExtensions *)
             ((long)&scc_analyzer_1.analysis_cache_.
                     super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                     .
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
             + 0x18));
  local_4c8._0_4_ = kNoEnforcement;
  local_4c8._4_1_ = false;
  local_4c8._5_1_ = false;
  local_4c8._6_1_ = false;
  local_4c8._7_1_ = false;
  uStack_4c0._0_1_ = false;
  uStack_4c0._1_1_ = false;
  uStack_4c0._2_1_ = false;
  uStack_4c0._3_1_ = false;
  uStack_4c0._4_1_ = false;
  uStack_4c0._5_1_ = false;
  uStack_4c0._6_1_ = false;
  uStack_4c0._7_1_ = false;
  local_4f8.forbidden_field_listener_events.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)0x0;
  uStack_4d0._0_4_ = kNoEnforcement;
  uStack_4d0._4_4_ = 0;
  local_4f8.forbidden_field_listener_events.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_4f8.forbidden_field_listener_events.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = (ctrl_t *)0x0;
  local_4f8.inject_field_listener_events = false;
  local_4f8._1_7_ = 0;
  local_4f8.forbidden_field_listener_events.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_518.field_2._M_allocated_capacity = 0;
  local_518.field_2._8_8_ = 0;
  local_518._M_dataplus = (_Alloc_hider)0x0;
  local_518._1_7_ = 0;
  local_518._M_string_length = 0;
  local_538.field_2._M_allocated_capacity = 0;
  local_538.field_2._8_8_ = 0;
  local_538._M_dataplus = (_Alloc_hider)0x0;
  local_538._1_7_ = 0;
  local_538._M_string_length = 0;
  local_558.field_2._M_allocated_capacity = 0;
  local_558.field_2._8_8_ = 0;
  local_558._M_dataplus = (_Alloc_hider)0x0;
  local_558._1_7_ = 0;
  local_558._M_string_length = 0;
  local_578.field_2._M_allocated_capacity = 0;
  local_578.field_2._8_8_ = 0;
  local_578._M_dataplus = (_Alloc_hider)0x0;
  local_578._1_7_ = 0;
  local_578._M_string_length = 0;
  scc_1 = (SCC *)0x0;
  pSStack_580 = (SplitMap *)0x0;
  local_4b8._0_1_ = false;
  local_4b8._1_7_ = 0;
  Options::Options((Options *)&scc_1);
  MessageSCCAnalyzer::MessageSCCAnalyzer((MessageSCCAnalyzer *)local_4a8,(Options *)&scc_1);
  Options::~Options((Options *)&scc_1);
  pDVar3 = proto2_unittest::TestAllExtensions::GetDescriptor();
  pSVar4 = MessageSCCAnalyzer::GetSCC((MessageSCCAnalyzer *)local_4a8,pDVar3);
  MVar2 = MessageSCCAnalyzer::GetSCCAnalysis((MessageSCCAnalyzer *)local_4a8,pSVar4);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._3_4_ = MVar2._0_4_;
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = MVar2.contains_weak;
  local_5a9 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_5a8,"result.is_recursive","false",
             (bool *)((long)&gtest_ar_4.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 3),&local_5a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x841,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  local_5d1 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_5d0,"result.contains_required","false",
             (bool *)((long)&gtest_ar_4.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 6),&local_5d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x842,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  local_5f9 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_5f8,"result.contains_cord","false",
             (bool *)((long)&gtest_ar_4.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4),&local_5f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x843,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  local_621 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_620,"result.contains_extension","true",
             (bool *)((long)&gtest_ar_4.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 5),&local_621);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_630);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&msg_2.field_0 + 0x90),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x844,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&msg_2.field_0 + 0x90),&local_630);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&msg_2.field_0 + 0x90));
    testing::Message::~Message(&local_630);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  MessageSCCAnalyzer::~MessageSCCAnalyzer((MessageSCCAnalyzer *)local_4a8);
  proto2_unittest::TestAllExtensions::~TestAllExtensions
            ((TestAllExtensions *)
             ((long)&scc_analyzer_1.analysis_cache_.
                     super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                     .
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
             + 0x18));
  proto2_unittest::TestRequired::TestRequired
            ((TestRequired *)
             ((long)&scc_analyzer_2.analysis_cache_.
                     super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                     .
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
             + 0x18));
  local_848._0_4_ = kNoEnforcement;
  local_848._4_1_ = false;
  local_848._5_1_ = false;
  local_848._6_1_ = false;
  local_848._7_1_ = false;
  uStack_840._0_1_ = false;
  uStack_840._1_1_ = false;
  uStack_840._2_1_ = false;
  uStack_840._3_1_ = false;
  uStack_840._4_1_ = false;
  uStack_840._5_1_ = false;
  uStack_840._6_1_ = false;
  uStack_840._7_1_ = false;
  local_878.forbidden_field_listener_events.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)0x0;
  uStack_850._0_4_ = kNoEnforcement;
  uStack_850._4_4_ = 0;
  local_878.forbidden_field_listener_events.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_878.forbidden_field_listener_events.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = (ctrl_t *)0x0;
  local_878.inject_field_listener_events = false;
  local_878._1_7_ = 0;
  local_878.forbidden_field_listener_events.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_898.field_2._M_allocated_capacity = 0;
  local_898.field_2._8_8_ = 0;
  local_898._M_dataplus = (_Alloc_hider)0x0;
  local_898._1_7_ = 0;
  local_898._M_string_length = 0;
  local_8b8.field_2._M_allocated_capacity = 0;
  local_8b8.field_2._8_8_ = 0;
  local_8b8._M_dataplus = (_Alloc_hider)0x0;
  local_8b8._1_7_ = 0;
  local_8b8._M_string_length = 0;
  local_8d8.field_2._M_allocated_capacity = 0;
  local_8d8.field_2._8_8_ = 0;
  local_8d8._M_dataplus = (_Alloc_hider)0x0;
  local_8d8._1_7_ = 0;
  local_8d8._M_string_length = 0;
  local_8f8.field_2._M_allocated_capacity = 0;
  local_8f8.field_2._8_8_ = 0;
  local_8f8._M_dataplus = (_Alloc_hider)0x0;
  local_8f8._1_7_ = 0;
  local_8f8._M_string_length = 0;
  scc_2 = (SCC *)0x0;
  pSStack_900 = (SplitMap *)0x0;
  local_838._0_1_ = false;
  local_838._1_7_ = 0;
  Options::Options((Options *)&scc_2);
  MessageSCCAnalyzer::MessageSCCAnalyzer((MessageSCCAnalyzer *)local_830,(Options *)&scc_2);
  Options::~Options((Options *)&scc_2);
  pDVar3 = proto2_unittest::TestRequired::GetDescriptor();
  pSVar4 = MessageSCCAnalyzer::GetSCC((MessageSCCAnalyzer *)local_830,pDVar3);
  MVar2 = MessageSCCAnalyzer::GetSCCAnalysis((MessageSCCAnalyzer *)local_830,pSVar4);
  gtest_ar_8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._3_4_ = MVar2._0_4_;
  gtest_ar_8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = MVar2.contains_weak;
  local_929 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_928,"result.is_recursive","false",
             (bool *)((long)&gtest_ar_8.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 3),&local_929);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_928);
  if (!bVar1) {
    testing::Message::Message(&local_938);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_928);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x84b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_928);
  local_951 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_950,"result.contains_required","true",
             (bool *)((long)&gtest_ar_8.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 6),&local_951);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
  if (!bVar1) {
    testing::Message::Message(&local_960);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x84c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_960);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_960);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
  local_979 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_978,"result.contains_cord","false",
             (bool *)((long)&gtest_ar_8.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4),&local_979);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_978);
  if (!bVar1) {
    testing::Message::Message(&local_988);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_978);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x84d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_988);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_988);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_978);
  local_9a1 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_9a0,"result.contains_extension","false",
             (bool *)((long)&gtest_ar_8.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 5),&local_9a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a0);
  if (!bVar1) {
    testing::Message::Message(&local_9b0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_9a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_9b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x84e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_9b8,&local_9b0);
    testing::internal::AssertHelper::~AssertHelper(&local_9b8);
    testing::Message::~Message(&local_9b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a0);
  MessageSCCAnalyzer::~MessageSCCAnalyzer((MessageSCCAnalyzer *)local_830);
  proto2_unittest::TestRequired::~TestRequired
            ((TestRequired *)
             ((long)&scc_analyzer_2.analysis_cache_.
                     super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                     .
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
             + 0x18));
  return;
}

Assistant:

TEST(HELPERS_TEST_NAME, TestSCCAnalysis) {
  {
    UNITTEST::TestRecursiveMessage msg;
    MessageSCCAnalyzer scc_analyzer((Options()));
    const SCC* scc = scc_analyzer.GetSCC(msg.GetDescriptor());
    MessageAnalysis result = scc_analyzer.GetSCCAnalysis(scc);
    EXPECT_EQ(result.is_recursive, true);
    EXPECT_EQ(result.contains_required, false);
    EXPECT_EQ(result.contains_cord, false);
    EXPECT_EQ(result.contains_extension, false);
  }
  {
    UNITTEST::TestAllExtensions msg;
    MessageSCCAnalyzer scc_analyzer((Options()));
    const SCC* scc = scc_analyzer.GetSCC(msg.GetDescriptor());
    MessageAnalysis result = scc_analyzer.GetSCCAnalysis(scc);
    EXPECT_EQ(result.is_recursive, false);
    EXPECT_EQ(result.contains_required, false);
    EXPECT_EQ(result.contains_cord, false);
    EXPECT_EQ(result.contains_extension, true);
  }
  {
    UNITTEST::TestRequired msg;
    MessageSCCAnalyzer scc_analyzer((Options()));
    const SCC* scc = scc_analyzer.GetSCC(msg.GetDescriptor());
    MessageAnalysis result = scc_analyzer.GetSCCAnalysis(scc);
    EXPECT_EQ(result.is_recursive, false);
    EXPECT_EQ(result.contains_required, true);
    EXPECT_EQ(result.contains_cord, false);
    EXPECT_EQ(result.contains_extension, false);
  }
}